

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::set_key_anchor(Tree *this,size_t node,csubstr anchor)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  size_t in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Tree *in_RDI;
  basic_substring<const_char> bVar4;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Location *in_stack_ffffffffffffff70;
  NodeType_e in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  char *local_70;
  size_t local_68;
  size_t in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  char in_stack_ffffffffffffffb7;
  basic_substring<const_char> *in_stack_ffffffffffffffb8;
  NodeType_e in_stack_ffffffffffffffc0;
  Tree *pTVar5;
  
  pTVar5 = in_RDI;
  pNVar3 = _p((Tree *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
              in_stack_ffffffffffffffa8);
  if (((pNVar3->m_type).type & KEYREF) != NOTYPE) {
    eVar2 = get_error_flags();
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffffc0;
    if (((eVar2 & 1) != 0) &&
       (bVar1 = is_debugger_attached(), in_stack_ffffffffffffff78 = in_stack_ffffffffffffffc0, bVar1
       )) {
      trap_instruction();
      in_stack_ffffffffffffff78 = in_stack_ffffffffffffffc0;
    }
    Location::Location(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff58);
    loc.super_LineCol.line = in_RSI;
    loc.super_LineCol.offset = in_stack_ffffffffffffff78;
    loc.super_LineCol.col = (size_t)pTVar5;
    loc.name.str = (char *)in_RDX;
    loc.name.len = in_RCX;
    error<33ul>((char (*) [33])CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),loc);
  }
  bVar4 = basic_substring<const_char>::triml(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
  pNVar3 = _p((Tree *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
              in_stack_ffffffffffffffa8);
  local_70 = bVar4.str;
  (pNVar3->m_key).anchor.str = local_70;
  local_68 = bVar4.len;
  (pNVar3->m_key).anchor.len = local_68;
  _add_flags(in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void set_key_anchor(size_t node, csubstr anchor) { RYML_ASSERT( ! is_key_ref(node)); _p(node)->m_key.anchor = anchor.triml('&'); _add_flags(node, KEYANCH); }